

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O3

void age_spells(void)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (spl_book[lVar1].sp_id == 0) {
      return;
    }
    if (spl_book[lVar1].sp_know != 0) {
      spl_book[lVar1].sp_know = spl_book[lVar1].sp_know + -1;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x2b);
  return;
}

Assistant:

void age_spells(void)
{
	int i;
	/*
	 * The time relative to the hero (a pass through move
	 * loop) causes all spell knowledge to be decremented.
	 * The hero's speed, rest status, conscious status etc.
	 * does not alter the loss of memory.
	 */
	for (i = 0; i < MAXSPELL && spellid(i) != NO_SPELL; i++)
	    if (spellknow(i))
		decrnknow(i);
	return;
}